

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O3

SQInteger sqstd_rex_newnode(SQRex *exp,SQRexNodeType type)

{
  long lVar1;
  SQRexNode *pSVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = -1;
  if (type == 0x102) {
    lVar4 = exp->_nsubexpr;
    exp->_nsubexpr = lVar4 + 1;
  }
  lVar1 = exp->_nallocated;
  lVar3 = exp->_nsize;
  if (lVar3 < lVar1) {
    pSVar2 = exp->_nodes;
  }
  else {
    exp->_nallocated = lVar1 * 2;
    pSVar2 = (SQRexNode *)sq_realloc(exp->_nodes,lVar1 << 5,lVar1 << 6);
    exp->_nodes = pSVar2;
    lVar3 = exp->_nsize;
  }
  exp->_nsize = lVar3 + 1;
  pSVar2[lVar3].type = type;
  pSVar2[lVar3].left = -1;
  pSVar2[lVar3].right = lVar4;
  pSVar2[lVar3].next = -1;
  return exp->_nsize + -1;
}

Assistant:

static SQInteger sqstd_rex_newnode(SQRex *exp, SQRexNodeType type)
{
    SQRexNode n;
    n.type = type;
    n.next = n.right = n.left = -1;
    if(type == OP_EXPR)
        n.right = exp->_nsubexpr++;
    if(exp->_nallocated < (exp->_nsize + 1)) {
        SQInteger oldsize = exp->_nallocated;
        exp->_nallocated *= 2;
        exp->_nodes = (SQRexNode *)sq_realloc(exp->_nodes, oldsize * sizeof(SQRexNode) ,exp->_nallocated * sizeof(SQRexNode));
    }
    exp->_nodes[exp->_nsize++] = n;
    SQInteger newid = exp->_nsize - 1;
    return (SQInteger)newid;
}